

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

LoadStatus __thiscall BuildLog::Load(BuildLog *this,string *path,string *err)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  undefined1 *puVar4;
  longlong lVar5;
  void *pvVar6;
  iterator iVar7;
  string *psVar8;
  ulonglong uVar9;
  uint64_t uVar10;
  int *piVar11;
  Metric *pMVar12;
  size_t extraout_RDX;
  size_t sVar13;
  LoadStatus LVar14;
  char *pcVar15;
  char *pcVar16;
  LogEntry *this_01;
  StringPiece command;
  pair<std::__detail::_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>,_bool>
  pVar17;
  int log_version;
  char *line_end;
  __hashtable *__h;
  char *line_start;
  string output;
  ScopedMetric metrics_h_scoped;
  LineReader reader;
  int iStack_400f4;
  int iStack_400f0;
  uint uStack_400ec;
  char *pcStack_400e8;
  ulong uStack_400e0;
  BuildLog *pBStack_400d8;
  char *pcStack_400d0;
  int iStack_400c4;
  char *pcStack_400c0;
  FILE *pFStack_400b8;
  long *plStack_400b0;
  size_t sStack_400a8;
  long alStack_400a0 [2];
  string *psStack_40090;
  string *psStack_40088;
  string *psStack_40080;
  key_type kStack_40078;
  string *psStack_40068;
  ScopedMetric SStack_40060;
  undefined1 auStack_40050 [16];
  FILE aFStack_40040 [1213];
  
  if (Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar2 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    if (iVar2 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar12 = (Metric *)0x0;
      }
      else {
        auStack_40050._0_8_ = aFStack_40040;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_40050,".ninja_log load","");
        pMVar12 = Metrics::NewMetric(this_00,(string *)auStack_40050);
        if ((FILE *)auStack_40050._0_8_ != aFStack_40040) {
          operator_delete((void *)auStack_40050._0_8_,aFStack_40040[0]._0_8_ + 1);
        }
      }
      Load::metrics_h_metric = pMVar12;
      __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric
                         );
    }
  }
  ScopedMetric::ScopedMetric(&SStack_40060,Load::metrics_h_metric);
  pFVar3 = fopen((path->_M_dataplus)._M_p,"r");
  if (pFVar3 != (FILE *)0x0) {
    iStack_400f4 = 0;
    pBStack_400d8 = this;
    pFStack_400b8 = pFVar3;
    psStack_40088 = path;
    psStack_40080 = err;
    auStack_40050._0_8_ = pFVar3;
    memset(auStack_40050 + 8,0,0x40000);
    pcStack_400d0 = (char *)0x0;
    pcStack_400e8 = (char *)0x0;
    uStack_400e0 = 0;
    uStack_400ec = 0;
    do {
      do {
        bVar1 = LineReader::ReadLine((LineReader *)auStack_40050,&pcStack_400d0,&pcStack_400e8);
        if (!bVar1) {
          fclose(pFStack_400b8);
          if ((pcStack_400d0 != (char *)0x0) &&
             ((iStack_400f4 < 5 ||
              ((100 < uStack_400ec && ((int)uStack_400e0 * 3 < (int)uStack_400ec)))))) {
            pBStack_400d8->needs_recompaction_ = true;
          }
LAB_00107508:
          LVar14 = LOAD_SUCCESS;
          goto LAB_0010750d;
        }
        if (iStack_400f4 == 0) {
          __isoc99_sscanf(pcStack_400d0,"# ninja log v%d\n",&iStack_400f4);
          if (iStack_400f4 < 4) {
            std::__cxx11::string::_M_replace
                      ((ulong)psStack_40080,0,(char *)psStack_40080->_M_string_length,0x1261a1);
            fclose(pFStack_400b8);
            unlink((psStack_40088->_M_dataplus)._M_p);
            goto LAB_00107508;
          }
        }
        pcVar15 = pcStack_400d0;
      } while (pcStack_400e8 == (char *)0x0);
      puVar4 = (undefined1 *)memchr(pcStack_400d0,9,(long)pcStack_400e8 - (long)pcStack_400d0);
      if (puVar4 != (undefined1 *)0x0) {
        *puVar4 = 0;
        iStack_400f0 = atoi(pcVar15);
        pcVar15 = puVar4 + 1;
        puVar4 = (undefined1 *)memchr(pcVar15,9,(long)pcStack_400e8 - (long)pcVar15);
        if (puVar4 != (undefined1 *)0x0) {
          *puVar4 = 0;
          pcVar16 = puVar4 + 1;
          puVar4 = (undefined1 *)memchr(pcVar16,9,(long)pcStack_400e8 - (long)pcVar16);
          if (puVar4 != (undefined1 *)0x0) {
            iStack_400c4 = atoi(pcVar15);
            *puVar4 = 0;
            lVar5 = strtoll(pcVar16,(char **)0x0,10);
            puVar4 = puVar4 + 1;
            pvVar6 = memchr(puVar4,9,(long)pcStack_400e8 - (long)puVar4);
            if (pvVar6 != (void *)0x0) {
              plStack_400b0 = alStack_400a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&plStack_400b0,puVar4,pvVar6);
              pcStack_400c0 = pcStack_400e8;
              kStack_40078.str_ = (char *)plStack_400b0;
              kStack_40078.len_ = sStack_400a8;
              iVar7 = std::
                      _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)pBStack_400d8,&kStack_40078);
              if (iVar7.
                  super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                  ._M_cur == (__node_type *)0x0) {
                psVar8 = (string *)operator_new(0x38);
                *(string **)psVar8 = psVar8 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          (psVar8,plStack_400b0,(long)plStack_400b0 + sStack_400a8);
                kStack_40078.str_ = *(char **)psVar8;
                kStack_40078.len_ = *(size_t *)(psVar8 + 8);
                psStack_40090 = psVar8;
                psStack_40068 = psVar8;
                pVar17 = std::
                         _Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         ::_M_emplace<std::pair<StringPiece_const,BuildLog::LogEntry*>>
                                   ((_Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                     *)pBStack_400d8);
                sVar13 = pVar17._8_8_;
                uStack_400e0 = (ulong)((int)uStack_400e0 + 1);
                psVar8 = psStack_40090;
              }
              else {
                psVar8 = *(string **)
                          ((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                                 ._M_cur + 0x18);
                sVar13 = extraout_RDX;
              }
              pcVar15 = pcStack_400c0;
              this_01 = (LogEntry *)((long)pvVar6 + 1);
              *(int *)(psVar8 + 0x28) = iStack_400f0;
              *(int *)(psVar8 + 0x2c) = iStack_400c4;
              *(longlong *)(psVar8 + 0x30) = lVar5;
              if (iStack_400f4 < 5) {
                command.str_ = pcStack_400c0 + -(long)this_01;
                command.len_ = sVar13;
                uVar10 = LogEntry::HashCommand(this_01,command);
                *(uint64_t *)(psVar8 + 0x20) = uVar10;
              }
              else {
                iStack_400f0 = CONCAT31(iStack_400f0._1_3_,*pcStack_400c0);
                *pcStack_400c0 = '\0';
                uVar9 = strtoull((char *)this_01,(char **)0x0,0x10);
                *(ulonglong *)(psVar8 + 0x20) = uVar9;
                *pcVar15 = (char)iStack_400f0;
              }
              if (plStack_400b0 != alStack_400a0) {
                operator_delete(plStack_400b0,alStack_400a0[0] + 1);
              }
              uStack_400ec = uStack_400ec + 1;
            }
          }
        }
      }
    } while( true );
  }
  piVar11 = __errno_location();
  LVar14 = LOAD_NOT_FOUND;
  if (*piVar11 != 2) {
    pcVar16 = strerror(*piVar11);
    pcVar15 = (char *)err->_M_string_length;
    strlen(pcVar16);
    LVar14 = LOAD_ERROR;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar15,(ulong)pcVar16);
  }
LAB_0010750d:
  ScopedMetric::~ScopedMetric(&SStack_40060);
  return LVar14;
}

Assistant:

LoadStatus BuildLog::Load(const string& path, string* err) {
  METRIC_RECORD(".ninja_log load");
  FILE* file = fopen(path.c_str(), "r");
  if (!file) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  int log_version = 0;
  int unique_entry_count = 0;
  int total_entry_count = 0;

  LineReader reader(file);
  char* line_start = 0;
  char* line_end = 0;
  while (reader.ReadLine(&line_start, &line_end)) {
    if (!log_version) {
      sscanf(line_start, kFileSignature, &log_version);

      if (log_version < kOldestSupportedVersion) {
        *err = ("build log version invalid, perhaps due to being too old; "
                "starting over");
        fclose(file);
        unlink(path.c_str());
        // Don't report this as a failure.  An empty build log will cause
        // us to rebuild the outputs anyway.
        return LOAD_SUCCESS;
      }
    }

    // If no newline was found in this chunk, read the next.
    if (!line_end)
      continue;

    const char kFieldSeparator = '\t';

    char* start = line_start;
    char* end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;

    int start_time = 0, end_time = 0;
    TimeStamp restat_mtime = 0;

    start_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    end_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    restat_mtime = strtoll(start, NULL, 10);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    string output = string(start, end - start);

    start = end + 1;
    end = line_end;

    LogEntry* entry;
    Entries::iterator i = entries_.find(output);
    if (i != entries_.end()) {
      entry = i->second;
    } else {
      entry = new LogEntry(output);
      entries_.insert(Entries::value_type(entry->output, entry));
      ++unique_entry_count;
    }
    ++total_entry_count;

    entry->start_time = start_time;
    entry->end_time = end_time;
    entry->mtime = restat_mtime;
    if (log_version >= 5) {
      char c = *end; *end = '\0';
      entry->command_hash = (uint64_t)strtoull(start, NULL, 16);
      *end = c;
    } else {
      entry->command_hash = LogEntry::HashCommand(StringPiece(start,
                                                              end - start));
    }
  }
  fclose(file);

  if (!line_start) {
    return LOAD_SUCCESS; // file was empty
  }

  // Decide whether it's time to rebuild the log:
  // - if we're upgrading versions
  // - if it's getting large
  int kMinCompactionEntryCount = 100;
  int kCompactionRatio = 3;
  if (log_version < kCurrentVersion) {
    needs_recompaction_ = true;
  } else if (total_entry_count > kMinCompactionEntryCount &&
             total_entry_count > unique_entry_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}